

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++:549:62)>
::getImpl(SimpleTransformPromiseNode<kj::Maybe<capnp::MessageReaderAndFds>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_serialize_async_c__:549:62)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  char (*in_RCX) [15];
  Array<char> local_590;
  Own<capnp::MessageReader,_std::nullptr_t> local_578;
  OwnFd *local_568;
  size_t sStack_560;
  NullableValue<capnp::MessageReaderAndFds> local_558;
  ExceptionOr<capnp::MessageReaderAndFds> local_530;
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_> depResult;
  Exception local_1a8;
  
  depResult.super_ExceptionOrValue.exception.ptr.isSet = false;
  depResult.value.ptr.isSet = false;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&depResult.super_ExceptionOrValue);
  if (depResult.super_ExceptionOrValue.exception.ptr.isSet == true) {
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_530,
               &depResult.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_530.value.ptr.isSet = false;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_530);
    ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr(&local_530);
  }
  else if (depResult.value.ptr.isSet == true) {
    Maybe<capnp::MessageReaderAndFds>::Maybe
              ((Maybe<capnp::MessageReaderAndFds> *)&local_558,&depResult.value.ptr.field_1.value);
    uVar1 = local_558.field_1.value.reader.ptr;
    if (local_558.isSet == false) {
      Debug::makeDescription<char_const(&)[15]>
                ((String *)&local_590,(Debug *)"\"Premature EOF.\"","Premature EOF.",in_RCX);
      Exception::Exception
                (&local_1a8,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize-async.c++"
                 ,0x229,(String *)&local_590);
      throwRecoverableException(&local_1a8,0);
      Exception::~Exception(&local_1a8);
      Array<char>::~Array(&local_590);
      unreachable();
    }
    local_558.field_1.value.reader.ptr = (MessageReader *)0x0;
    local_578.disposer = local_558.field_1.value.reader.disposer;
    local_568 = local_558.field_1.value.fds.ptr;
    sStack_560 = local_558.field_1.value.fds.size_;
    NullableValue<capnp::MessageReaderAndFds>::~NullableValue(&local_558);
    local_530.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_530.value.ptr.isSet = true;
    local_578.ptr = (MessageReader *)0x0;
    local_530.value.ptr.field_1.value.reader.disposer = local_558.field_1.value.reader.disposer;
    local_530.value.ptr.field_1.value.reader.ptr = (MessageReader *)uVar1;
    local_530.value.ptr.field_1.value.fds.ptr = local_568;
    local_530.value.ptr.field_1.value.fds.size_ = sStack_560;
    ExceptionOr<capnp::MessageReaderAndFds>::operator=
              ((ExceptionOr<capnp::MessageReaderAndFds> *)output,&local_530);
    ExceptionOr<capnp::MessageReaderAndFds>::~ExceptionOr(&local_530);
    Own<capnp::MessageReader,_std::nullptr_t>::dispose(&local_578);
  }
  ExceptionOr<kj::Maybe<capnp::MessageReaderAndFds>_>::~ExceptionOr(&depResult);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }